

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O0

int jpc_qcd_dumpparms(jpc_ms_t *ms,FILE *out)

{
  uint uVar1;
  uint uVar2;
  uint local_24;
  int i;
  jpc_qcd_t *qcd;
  FILE *out_local;
  jpc_ms_t *ms_local;
  
  fprintf((FILE *)out,"qntsty = %d; numguard = %d; numstepsizes = %d\n",(ulong)(ms->parms).cod.csty,
          (ulong)(ms->parms).sot.partno,(ulong)*(uint *)((long)&ms->parms + 4));
  for (local_24 = 0; (int)local_24 < *(int *)((long)&ms->parms + 4); local_24 = local_24 + 1) {
    uVar1 = JPC_QCX_GETEXPN((uint)*(undefined8 *)
                                   (&((ms->parms).poc.pchgs)->prgord + (long)(int)local_24 * 8));
    uVar2 = JPC_QCX_GETMANT((uint)*(undefined8 *)
                                   (&((ms->parms).poc.pchgs)->prgord + (long)(int)local_24 * 8));
    fprintf((FILE *)out,"expn[%d] = 0x%04x; mant[%d] = 0x%04x;\n",(ulong)local_24,(ulong)uVar1,
            (ulong)local_24,(ulong)uVar2);
  }
  return 0;
}

Assistant:

static int jpc_qcd_dumpparms(jpc_ms_t *ms, FILE *out)
{
	jpc_qcd_t *qcd = &ms->parms.qcd;
	int i;
	fprintf(out, "qntsty = %d; numguard = %d; numstepsizes = %d\n",
	  (int) qcd->compparms.qntsty, qcd->compparms.numguard, qcd->compparms.numstepsizes);
	for (i = 0; i < qcd->compparms.numstepsizes; ++i) {
		fprintf(out, "expn[%d] = 0x%04x; mant[%d] = 0x%04x;\n",
		  i, JAS_CAST(unsigned, JPC_QCX_GETEXPN(qcd->compparms.stepsizes[i])),
		  i, JAS_CAST(unsigned, JPC_QCX_GETMANT(qcd->compparms.stepsizes[i])));
	}
	return 0;
}